

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::~Expected
          (Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *this)

{
  if ((this->field_0x30 & 1) != 0) {
    getErrorStorage(this);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)this);
    return;
  }
  getStorage(this);
  SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>::~SmallVectorImpl
            ((SmallVectorImpl<(anonymous_namespace)::ContentDescriptor> *)this);
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }